

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.c
# Opt level: O1

rt_function_error_t allocate_deconvolution_local_context(rt_function_t *f)

{
  uint uVar1;
  undefined8 *puVar2;
  rt_variable_t *prVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  rt_variable_getter p_Var9;
  rt_variable_setter p_Var10;
  code *pcVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  rt_list_t rVar16;
  
  if ((f->num_of_inputs & 0xfffffffeU) != 2) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }
  puVar2 = (undefined8 *)f->local_context;
  plVar8 = (long *)(*rt_malloc_func)(0xa0);
  if (plVar8 == (long *)0x0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  *puVar2 = plVar8;
  prVar3 = *f->inputs;
  *plVar8 = (long)prVar3;
  p_Var9 = select_getter(prVar3);
  plVar8[1] = (long)p_Var9;
  prVar3 = f->inputs[1];
  plVar8[2] = (long)prVar3;
  p_Var9 = select_getter(prVar3);
  plVar8[3] = (long)p_Var9;
  prVar3 = *f->outputs;
  plVar8[6] = (long)prVar3;
  p_Var9 = select_getter(prVar3);
  plVar8[8] = (long)p_Var9;
  p_Var10 = select_setter((rt_variable_t *)plVar8[6]);
  plVar8[7] = (long)p_Var10;
  if (f->num_of_inputs < 3) {
    lVar13 = 0x20;
    p_Var9 = (rt_variable_getter)0x0;
  }
  else {
    prVar3 = f->inputs[2];
    plVar8[4] = (long)prVar3;
    p_Var9 = select_getter(prVar3);
    lVar13 = 0x28;
  }
  *(rt_variable_getter *)((long)plVar8 + lVar13) = p_Var9;
  *(undefined4 *)((long)plVar8 + 0x9c) = 1;
  uVar1 = *(uint *)(puVar2 + 1);
  if (0 < (long)(int)uVar1) {
    lVar13 = *(long *)(*plVar8 + 8);
    iVar12 = *(int *)((long)plVar8 + 0x9c);
    lVar14 = 0;
    do {
      iVar12 = iVar12 * *(int *)(lVar13 + lVar14 * 4);
      *(int *)((long)plVar8 + 0x9c) = iVar12;
      lVar14 = lVar14 + 1;
    } while ((int)uVar1 != lVar14);
  }
  iVar12 = *(int *)*plVar8;
  *(uint *)(plVar8 + 0x13) = ~uVar1 + iVar12;
  rVar16 = allocate_list(~uVar1 + iVar12);
  *(int *)(plVar8 + 9) = rVar16.size;
  plVar8[10] = (long)rVar16.data;
  rVar16 = allocate_list((int)plVar8[0x13]);
  *(int *)(plVar8 + 0xd) = rVar16.size;
  plVar8[0xe] = (long)rVar16.data;
  rVar16 = allocate_list((int)plVar8[0x13]);
  *(int *)(plVar8 + 0xb) = rVar16.size;
  plVar8[0xc] = (long)rVar16.data;
  rVar16 = allocate_list((int)plVar8[0x13]);
  *(int *)(plVar8 + 0xf) = rVar16.size;
  plVar8[0x10] = (long)rVar16.data;
  rVar16 = allocate_list((int)plVar8[0x13]);
  *(int *)(plVar8 + 0x11) = rVar16.size;
  plVar8[0x12] = (long)rVar16.data;
  if (0 < (int)plVar8[0x13]) {
    lVar13 = *(long *)(plVar8[2] + 8);
    lVar14 = plVar8[0xe];
    lVar4 = *(long *)(*plVar8 + 8);
    lVar5 = plVar8[10];
    lVar6 = *(long *)(plVar8[6] + 8);
    lVar7 = plVar8[0xc];
    lVar15 = 0;
    do {
      *(undefined4 *)(lVar14 + lVar15 * 4) = *(undefined4 *)(lVar13 + 8 + lVar15 * 4);
      *(undefined4 *)(lVar5 + lVar15 * 4) =
           *(undefined4 *)(lVar4 + 4 + (*(int *)(puVar2 + 1) + lVar15) * 4);
      *(undefined4 *)(lVar7 + lVar15 * 4) =
           *(undefined4 *)(lVar6 + 4 + (*(int *)(puVar2 + 1) + lVar15) * 4);
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)plVar8[0x13]);
  }
  if ((((*(byte *)(*plVar8 + 0x10) & 0xf) == 0) && ((*(byte *)(plVar8[6] + 0x10) & 0xf) == 0)) &&
     ((*(byte *)(plVar8[2] + 0x10) & 0xf) == 0)) {
    lVar13 = plVar8[4];
    pcVar11 = exec_deconvolution;
    if (((lVar13 == 0) || (lVar13 == 0)) || ((*(byte *)(lVar13 + 0x10) & 0xf) == 0))
    goto LAB_0011cc89;
  }
  pcVar11 = exec_deconvolution_generic;
LAB_0011cc89:
  f->exec_func = pcVar11;
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t allocate_deconvolution_local_context(rt_function_t *f) {
  deconvolution_local_context_t *c =
      (deconvolution_local_context_t *)(f->local_context);

  if (f->num_of_inputs != 2 && f->num_of_inputs != 3) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }

  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  deconvolution_private_t *p = rt_malloc_func(sizeof(deconvolution_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  c->data = (void *)p;
  p->input = f->inputs[0];
  p->get_input = select_getter(p->input);

  p->weight = f->inputs[1];
  p->get_weight = select_getter(p->weight);

  p->output = f->outputs[0];
  p->get_output = select_getter(p->output);
  p->set_output = select_setter(p->output);

  if (f->num_of_inputs > 2) {
    p->bias = f->inputs[2];
    p->get_bias = select_getter(p->bias);
  } else {
    p->bias = 0;
  }

  p->base_loop_size = 1;
  for (int i = 0; i < c->base_axis; i++) {
    p->base_loop_size *= p->input->shape.data[i];
  }
  p->spatial_dims = p->input->shape.size - c->base_axis - 1;

  p->input_shape = allocate_list(p->spatial_dims);
  p->kernel_shape = allocate_list(p->spatial_dims);
  p->output_shape = allocate_list(p->spatial_dims);
  p->in_position = allocate_list(p->spatial_dims);
  p->out_position = allocate_list(p->spatial_dims);

  for (int i = 0; i < p->spatial_dims; i++) {
    p->kernel_shape.data[i] = p->weight->shape.data[i + 2];
    p->input_shape.data[i] = p->input->shape.data[i + c->base_axis + 1];
    p->output_shape.data[i] = p->output->shape.data[i + c->base_axis + 1];
  }

  if (p->input->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT &&
      p->weight->type == NN_DATA_TYPE_FLOAT &&
      ((p->bias && p->bias->type == NN_DATA_TYPE_FLOAT) || !p->bias)) {
#ifdef CONFIG_DECONVOLUTION_FLOAT32
    f->exec_func = exec_deconvolution;
#endif /* CONFIG_DECONVOLUTION_FLOAT32 */
  } else {
#ifdef CONFIG_DECONVOLUTION_GENERIC
    f->exec_func = exec_deconvolution_generic;
#endif /* CONFIG_DECONVOLUTION_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}